

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerMSL::get_or_allocate_builtin_output_member_location
          (CompilerMSL *this,BuiltIn builtin,uint32_t type_id,uint32_t index,uint32_t *comp)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  const_iterator cVar5;
  BuiltIn *pBVar6;
  uint uVar7;
  BuiltIn argument;
  BuiltIn local_4c;
  TypeID local_48;
  uint32_t local_44;
  SPIRType *local_40;
  ulong local_38;
  
  uVar3 = get_member_location(this,type_id,index,comp);
  if (uVar3 != 0xffffffff) {
    return uVar3;
  }
  if (comp != (uint32_t *)0x0) {
    *comp = 0xffffffff;
  }
  local_48.id = type_id;
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + type_id);
  local_44 = index;
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (pSVar4->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].id);
  uVar3 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar4);
  if (uVar3 != 0) {
    argument = BuiltInPosition;
    local_40 = pSVar4;
    local_38 = (ulong)builtin;
    do {
      local_4c = argument;
      cVar5 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->location_outputs_in_use)._M_h,&local_4c);
      if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        uVar1 = 1;
        do {
          uVar7 = uVar1;
          if (uVar3 == uVar7) break;
          local_4c = argument + uVar7;
          cVar5 = ::std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&(this->location_outputs_in_use)._M_h,&local_4c);
          uVar1 = uVar7 + 1;
        } while (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0);
        if (uVar3 <= uVar7) goto LAB_002dca48;
      }
      argument = argument + BuiltInPointSize;
    } while( true );
  }
  argument = BuiltInPosition;
LAB_002dca57:
  Compiler::set_member_decoration((Compiler *)this,local_48,local_44,DecorationLocation,argument);
  bVar2 = Compiler::is_tessellating_triangles((Compiler *)this);
  local_4c = builtin;
  if (builtin - BuiltInTessLevelOuter < 2 && bVar2) {
    local_4c = BuiltInTessLevelInner;
    pBVar6 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->builtin_to_automatic_output_location,&local_4c);
    *pBVar6 = argument;
    local_4c = BuiltInTessLevelOuter;
  }
  pBVar6 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->builtin_to_automatic_output_location,&local_4c);
  *pBVar6 = argument;
  mark_location_as_used_by_shader(this,argument,pSVar4,StorageClassOutput,true);
  return argument;
LAB_002dca48:
  builtin = (BuiltIn)local_38;
  pSVar4 = local_40;
  goto LAB_002dca57;
}

Assistant:

uint32_t CompilerMSL::get_or_allocate_builtin_output_member_location(spv::BuiltIn builtin,
                                                                     uint32_t type_id, uint32_t index,
                                                                     uint32_t *comp)
{
	uint32_t loc = get_member_location(type_id, index, comp);
	if (loc != k_unknown_location)
		return loc;
	loc = 0;

	if (comp)
		*comp = k_unknown_component;

	// Late allocation. Find a location which is unused by the application.
	// This can happen for built-in outputs in tessellation which are mixed and matched with user inputs.
	auto &mbr_type = get<SPIRType>(get<SPIRType>(type_id).member_types[index]);
	uint32_t count = type_to_location_count(mbr_type);

	const auto location_range_in_use = [this](uint32_t location, uint32_t location_count) -> bool {
		for (uint32_t i = 0; i < location_count; i++)
			if (location_outputs_in_use.count(location + i) != 0)
				return true;
		return false;
	};

	while (location_range_in_use(loc, count))
		loc++;

	set_member_decoration(type_id, index, DecorationLocation, loc);

	// Triangle tess level inputs are shared in one packed float4;
	// mark both builtins as sharing one location.
	if (is_tessellating_triangles() && (builtin == BuiltInTessLevelInner || builtin == BuiltInTessLevelOuter))
	{
		builtin_to_automatic_output_location[BuiltInTessLevelInner] = loc;
		builtin_to_automatic_output_location[BuiltInTessLevelOuter] = loc;
	}
	else
		builtin_to_automatic_output_location[builtin] = loc;

	mark_location_as_used_by_shader(loc, mbr_type, StorageClassOutput, true);
	return loc;
}